

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setSceneRect(QGraphicsScene *this,QRectF *rect)

{
  bool bVar1;
  QGraphicsScenePrivate *pQVar2;
  QRectF *in_RSI;
  QRectF *in_RDI;
  QGraphicsScenePrivate *d;
  QRectF *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QGraphicsScene *)0x9c9931);
  bVar1 = ::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    bVar1 = QRectF::isNull(in_RSI);
    *(uint *)&pQVar2->field_0xb8 =
         *(uint *)&pQVar2->field_0xb8 & 0xfffffffe | (uint)((bVar1 ^ 0xffU) & 1);
    (pQVar2->sceneRect).xp = in_RSI->xp;
    (pQVar2->sceneRect).yp = in_RSI->yp;
    (pQVar2->sceneRect).w = in_RSI->w;
    (pQVar2->sceneRect).h = in_RSI->h;
    if ((*(uint *)&pQVar2->field_0xb8 & 1) == 0) {
      in_RSI = &pQVar2->growingItemsBoundingRect;
    }
    sceneRectChanged((QGraphicsScene *)in_RDI,in_RSI);
  }
  return;
}

Assistant:

void QGraphicsScene::setSceneRect(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (rect != d->sceneRect) {
        d->hasSceneRect = !rect.isNull();
        d->sceneRect = rect;
        emit sceneRectChanged(d->hasSceneRect ? rect : d->growingItemsBoundingRect);
    }
}